

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O1

int __thiscall
CVmObjDate::sub_val(CVmObjDate *this,vm_val_t *result,vm_obj_id_t param_2,vm_val_t *val)

{
  int iVar1;
  int *piVar2;
  double dVar3;
  double d_00;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  vm_obj_id_t vVar7;
  int daytime;
  int32_t iVar8;
  ldiv_t lVar9;
  bignum_t<32> result_2;
  bignum_t<32> d;
  bignum_t<32> d1;
  bignum_t<32> d2;
  bignum_t<32> t1;
  bignum_t<32> result_3;
  bignum_t<32> result_1;
  bignum_t<32> t2;
  bignum_t<32> local_f6;
  long local_e0;
  bignum_t<32> local_d8;
  char local_ba [4];
  undefined1 local_b6;
  char local_a4 [4];
  undefined1 local_a0;
  char local_8e [4];
  undefined1 local_8a;
  undefined2 local_78;
  undefined2 uStack_76;
  uint uStack_74;
  undefined2 local_60;
  undefined2 uStack_5e;
  uint uStack_5c;
  char local_46 [4];
  undefined1 local_42;
  
  piVar2 = (int *)(this->super_CVmObject).ext_;
  iVar1 = *piVar2;
  daytime = piVar2[1];
  if ((val->typ == VM_OBJ) &&
     (iVar6 = (**(code **)(*(long *)&G_obj_table_X.pages_[(val->val).obj >> 0xc]
                                     [(val->val).obj & 0xfff].ptr_ + 8))
                        (G_obj_table_X.pages_[(val->val).obj >> 0xc] + ((val->val).obj & 0xfff),
                         metaclass_reg_), iVar6 != 0)) {
    piVar2 = *(int **)((long)&G_obj_table_X.pages_[(val->val).obj >> 0xc][(val->val).obj & 0xfff].
                              ptr_ + 8);
    iVar6 = *piVar2;
    local_e0 = (long)piVar2[1];
    local_ba[0] = ' ';
    local_ba[1] = '\0';
    local_b6 = 0;
    CVmObjBigNum::set_int_val(local_ba,(long)iVar1);
    local_8e[0] = ' ';
    local_8e[1] = '\0';
    local_8a = 0;
    CVmObjBigNum::set_int_val(local_8e,(long)daytime);
    local_a4[0] = ' ';
    local_a4[1] = '\0';
    local_a0 = 0;
    CVmObjBigNum::set_int_val(local_a4,(long)iVar6);
    local_46[0] = ' ';
    local_46[1] = '\0';
    local_42 = 0;
    CVmObjBigNum::set_int_val(local_46,local_e0);
    local_f6.ext[0] = ' ';
    local_f6.ext[1] = '\0';
    local_f6.ext[4] = '\0';
    CVmObjBigNum::set_int_val(local_f6.ext,86400000);
    local_60 = 0x20;
    uStack_5c = uStack_5c & 0xffffff00;
    CVmObjBigNum::compute_quotient_into((char *)&local_60,(char *)0x0,local_8e,local_f6.ext);
    local_d8.ext._2_2_ = uStack_5e;
    local_d8.ext._0_2_ = local_60;
    local_d8.ext._4_4_ = uStack_5c;
    local_f6.ext[0] = ' ';
    local_f6.ext[1] = '\0';
    local_f6.ext[4] = '\0';
    CVmObjBigNum::compute_sum_into(local_f6.ext,local_ba,local_d8.ext);
    CVmObjBigNum::copy_val(local_ba,local_f6.ext,1);
    local_f6.ext[0] = ' ';
    local_f6.ext[1] = '\0';
    local_f6.ext[4] = '\0';
    CVmObjBigNum::set_int_val(local_f6.ext,86400000);
    local_78 = 0x20;
    uStack_74 = uStack_74 & 0xffffff00;
    CVmObjBigNum::compute_quotient_into((char *)&local_78,(char *)0x0,local_46,local_f6.ext);
    local_d8.ext._2_2_ = uStack_76;
    local_d8.ext._0_2_ = local_78;
    local_d8.ext._4_4_ = uStack_74;
    local_f6.ext[0] = ' ';
    local_f6.ext[1] = '\0';
    local_f6.ext[4] = '\0';
    CVmObjBigNum::compute_sum_into(local_f6.ext,local_a4,local_d8.ext);
    CVmObjBigNum::copy_val(local_a4,local_f6.ext,1);
    local_f6.ext[0] = ' ';
    local_f6.ext[1] = '\0';
    local_f6.ext[4] = '\0';
    CVmObjBigNum::compute_diff_into(local_f6.ext,local_ba,local_a4);
    vVar7 = CVmObjBigNum::create<32>(0,&local_f6);
    result->typ = VM_OBJ;
    (result->val).obj = vVar7;
  }
  else {
    uVar4 = local_d8.ext._0_8_;
    if (val->typ == VM_INT) {
      iVar8 = iVar1 - (val->val).obj;
    }
    else {
      local_d8.ext._0_2_ = 0x20;
      uVar5 = local_d8.ext._0_8_;
      local_d8.ext._5_3_ = SUB83(uVar4,5);
      local_d8.ext._0_4_ = SUB84(uVar5,0);
      local_d8.ext[4] = '\0';
      bignum_t<32>::set(&local_d8,val);
      dVar3 = CVmObjBigNum::ext_to_double(local_d8.ext);
      dVar3 = floor(dVar3);
      if ((2147483647.0 < dVar3 - (double)iVar1) || (dVar3 - (double)iVar1 < -2147483648.0)) {
        err_throw(0x7e7);
      }
      local_f6.ext[0] = ' ';
      local_f6.ext[1] = '\0';
      local_f6.ext[4] = '\0';
      CVmObjBigNum::set_double_val(local_f6.ext,dVar3);
      local_8e[0] = ' ';
      local_8e[1] = '\0';
      local_8a = 0;
      CVmObjBigNum::compute_diff_into(local_8e,local_d8.ext,local_f6.ext);
      local_f6.ext[0] = ' ';
      local_f6.ext[1] = '\0';
      local_f6.ext[4] = '\0';
      CVmObjBigNum::set_int_val(local_f6.ext,86400000);
      local_ba[0] = ' ';
      local_ba[1] = '\0';
      local_b6 = 0;
      CVmObjBigNum::compute_prod_into(local_ba,local_8e,local_f6.ext);
      d_00 = CVmObjBigNum::ext_to_double(local_ba);
      iVar8 = round_int32(d_00);
      lVar9 = ldiv((long)(daytime - iVar8),86400000);
      iVar6 = (int)lVar9.rem;
      iVar8 = (iVar6 >> 0x1f) + (int)lVar9.quot + (iVar1 - (int)dVar3);
      daytime = iVar6 + 86400000;
      if (-1 < iVar6) {
        daytime = iVar6;
      }
    }
    vVar7 = create(0,iVar8,daytime);
    result->typ = VM_OBJ;
    (result->val).obj = vVar7;
  }
  return 1;
}

Assistant:

int CVmObjDate::sub_val(VMG_ vm_val_t *result, vm_obj_id_t /*self*/,
                        const vm_val_t *val)
{
    /* get my date and time */
    int32_t dayno = get_ext()->dayno;
    int32_t daytime = get_ext()->daytime;

    /* the other value must be a Date or something numeric */
    if (val->typ == VM_OBJ && is_date_obj(vmg_ val->val.obj))
    {
        /* get the other date's contents */
        CVmObjDate *vdate = (CVmObjDate *)vm_objp(vmg_ val->val.obj);
        int32_t vdayno = vdate->get_ext()->dayno;
        int32_t vdaytime = vdate->get_ext()->daytime;

        /* we need fractional days, so calculate as bignum_t */
        bignum_t<32> d1((long)dayno), t1((long)daytime);
        bignum_t<32> d2((long)vdayno), t2((long)vdaytime);
        d1 += (t1 / (long)(24*60*60*1000));
        d2 += (t2 / (long)(24*60*60*1000));

        /* return a BigNumber containing the result */
        result->set_obj(CVmObjBigNum::create(vmg_ FALSE, d1 - d2));

        /* handled (we don't want to return a Date, as the other paths do) */
        return TRUE;
    }
    else if (val->typ == VM_INT)
    {
        /* it's a simple integer - subtract the number of days */
        dayno -= val->val.intval;
    }
    else
    {
        /* it's not an int; calculate in the bignum domain */
        bignum_t<32> d(vmg_ val);

        /* make sure the integer portion won't overflow */
        double dd = floor((double)d);
        if (dd - dayno > INT32MAXVAL || dd - dayno < INT32MINVAL)
            err_throw(VMERR_NUM_OVERFLOW);

        /* add the whole part to my day number */
        dayno -= (int32_t)dd;

        /* 
         *   convert the fractional part to milliseconds (by multiplying it
         *   by the number of milliseconds in a day), then subtract it from
         *   my time value 
         */
        daytime -= round_int32((double)((d - dd) * (long)(24L*60*60*1000)));

        /* normalize, to carry time overflow/underflow into the date */
        caldate_t::normalize(dayno, daytime);
    }

    /* return a new Date object representing the result */
    result->set_obj(create(vmg_ FALSE, dayno, daytime));

    /* handled */
    return TRUE;
}